

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

string * __thiscall
re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  int *piVar1;
  char *pcVar2;
  int *piVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = "";
  piVar1 = (int *)(this->mutex_).mutex_.__align;
  for (piVar3 = piVar1; piVar3 != piVar1 + *(int *)&this->prog_; piVar3 = piVar3 + 1) {
    if (*piVar3 < (int)(this->mutex_).mutex_.__data.__wrphase_futex) {
      StringAppendF(__return_storage_ptr__,"%s%d",pcVar2);
      pcVar2 = ",";
    }
    else {
      StringAppendF(__return_storage_ptr__,"|",pcVar2);
      pcVar2 = "";
    }
    piVar1 = (int *)(this->mutex_).mutex_.__align;
  }
  return __return_storage_ptr__;
}

Assistant:

string DFA::DumpWorkq(Workq* q) {
  string s;
  const char* sep = "";
  for (DFA::Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      StringAppendF(&s, "|");
      sep = "";
    } else {
      StringAppendF(&s, "%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}